

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O0

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  int status_local;
  uv_stream_t *server_local;
  
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x59,"0 == status");
    abort();
  }
  iVar1 = uv_tcp_init(server->loop,&connection);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x5b,"0 == uv_tcp_init(server->loop, &connection)");
    abort();
  }
  iVar1 = uv_accept(server,(uv_stream_t *)&connection);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x5d,"0 == uv_accept(server, (uv_stream_t* )&connection)");
    abort();
  }
  iVar1 = uv_read_start((uv_stream_t *)&connection,on_alloc,on_read1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x5f,"0 == uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1)");
    abort();
  }
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  ASSERT(0 == status);

  ASSERT(0 == uv_tcp_init(server->loop, &connection));

  ASSERT(0 == uv_accept(server, (uv_stream_t* )&connection));

  ASSERT(0 == uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1));
}